

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

essentials_t * opengv::relative_pose::sevenpt(RelativeAdapterBase *adapter,Indices *indices)

{
  double dVar1;
  double dVar2;
  long *plVar3;
  int iVar4;
  Scalar *pSVar5;
  StorageBaseType *matrix;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *other;
  Indices *in_RDX;
  long *in_RSI;
  essentials_t *in_RDI;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
  *other_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int minIndex;
  double min;
  double val3;
  double val2;
  double val1;
  Matrix<std::complex<double>,_3,_1,_0,_3,_1> D;
  EigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> Eig;
  essential_t M;
  double eps;
  essential_t F2;
  MatrixXd F2_temp;
  essential_t F1;
  MatrixXd F1_temp;
  Matrix<double,_9,_1,_0,_9,_1> f2;
  Matrix<double,_9,_1,_0,_9,_1> f1;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  bearingVector_t f2_1;
  bearingVector_t f1_1;
  size_t i;
  MatrixXd A;
  size_t numberCorrespondences;
  essentials_t *essentials;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff118;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffff120;
  Indices *in_stack_fffffffffffff128;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff130;
  unsigned_long *in_stack_fffffffffffff138;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff140;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff148;
  undefined8 in_stack_fffffffffffff150;
  MatrixType *in_stack_fffffffffffff158;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffff160;
  double *in_stack_fffffffffffff168;
  undefined8 in_stack_fffffffffffff170;
  undefined1 computeEigenvectors;
  EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff178;
  EigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff180;
  EigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_ab8;
  XprTypeNested local_888;
  Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_880;
  undefined1 local_821;
  double local_820;
  non_const_type local_818;
  undefined4 local_690;
  undefined4 local_68c;
  non_const_type local_670;
  undefined4 local_4e8;
  undefined4 local_4e4;
  non_const_type local_178;
  non_const_type local_118;
  non_const_type local_b8;
  undefined1 local_88 [40];
  undefined1 local_60 [24];
  ulong local_48;
  undefined4 local_3c;
  size_t local_20;
  long *local_10;
  
  local_10 = in_RSI;
  local_20 = Indices::size(in_RDX);
  local_3c = 9;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff140,
             in_stack_fffffffffffff138,(int *)in_stack_fffffffffffff130);
  for (local_48 = 0; plVar3 = local_10,
      computeEigenvectors = (undefined1)((ulong)in_stack_fffffffffffff170 >> 0x38),
      local_48 < local_20; local_48 = local_48 + 1) {
    iVar4 = Indices::operator[](in_stack_fffffffffffff128,
                                (int)((ulong)in_stack_fffffffffffff120 >> 0x20));
    (**(code **)(*plVar3 + 0x18))(local_60,plVar3,(long)iVar4);
    plVar3 = local_10;
    iVar4 = Indices::operator[](in_stack_fffffffffffff128,
                                (int)((ulong)in_stack_fffffffffffff120 >> 0x20));
    (**(code **)(*plVar3 + 0x10))(local_88,plVar3,(long)iVar4);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff120
               ,(Index)in_stack_fffffffffffff118);
    local_b8 = (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                         (in_stack_fffffffffffff118);
    Eigen::operator*(in_stack_fffffffffffff168,(StorageBaseType *)in_stack_fffffffffffff160);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
              (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128,
               (Index)in_stack_fffffffffffff120);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
               in_stack_fffffffffffff120,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff118);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff120
               ,(Index)in_stack_fffffffffffff118);
    local_118 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          (in_stack_fffffffffffff118);
    Eigen::operator*(in_stack_fffffffffffff168,(StorageBaseType *)in_stack_fffffffffffff160);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
              (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128,
               (Index)in_stack_fffffffffffff120);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
               in_stack_fffffffffffff120,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff118);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff120
               ,(Index)in_stack_fffffffffffff118);
    local_178 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          (in_stack_fffffffffffff118);
    Eigen::operator*(in_stack_fffffffffffff168,(StorageBaseType *)in_stack_fffffffffffff160);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
              (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128,
               (Index)in_stack_fffffffffffff120);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
               in_stack_fffffffffffff120,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff118);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffff160,in_stack_fffffffffffff158,
             (uint)((ulong)in_stack_fffffffffffff150 >> 0x20));
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (&in_stack_fffffffffffff120->
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128);
  Eigen::Matrix<double,9,1,0,9,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
            ((Matrix<double,_9,_1,_0,_9,_1> *)in_stack_fffffffffffff120,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
              *)in_stack_fffffffffffff118);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (&in_stack_fffffffffffff120->
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128);
  Eigen::Matrix<double,9,1,0,9,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
            ((Matrix<double,_9,_1,_0,_9,_1> *)in_stack_fffffffffffff120,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
              *)in_stack_fffffffffffff118);
  local_4e4 = 3;
  local_4e8 = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff140,
             (int *)in_stack_fffffffffffff138,(int *)in_stack_fffffffffffff130);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffff130,
             (Index)in_stack_fffffffffffff128,(Index)in_stack_fffffffffffff120);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffff120,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffff118);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffff130,
             (Index)in_stack_fffffffffffff128,(Index)in_stack_fffffffffffff120);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffff120,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffff118);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffff130,
             (Index)in_stack_fffffffffffff128,(Index)in_stack_fffffffffffff120);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffff120,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffff118);
  local_670 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_fffffffffffff118);
  Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff120,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffff118);
  local_68c = 3;
  local_690 = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff140,
             (int *)in_stack_fffffffffffff138,(int *)in_stack_fffffffffffff130);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffff130,
             (Index)in_stack_fffffffffffff128,(Index)in_stack_fffffffffffff120);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffff120,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffff118);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffff130,
             (Index)in_stack_fffffffffffff128,(Index)in_stack_fffffffffffff120);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffff120,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffff118);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffff130,
             (Index)in_stack_fffffffffffff128,(Index)in_stack_fffffffffffff120);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff130,(Index)in_stack_fffffffffffff128);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffff120,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffff118);
  local_818 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_fffffffffffff118);
  Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff120,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffff118);
  local_820 = 1e-08;
  local_821 = 0;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xb89437);
  auVar6._0_8_ = Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                           ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xb89446);
  auVar6._8_8_ = 0;
  auVar10._8_8_ = 0x7fffffffffffffff;
  auVar10._0_8_ = 0x7fffffffffffffff;
  auVar6 = vpand_avx(auVar6,auVar10);
  if ((auVar6._0_8_ < local_820) || (7 < local_20)) {
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_fffffffffffff130,(value_type *)in_stack_fffffffffffff128);
  }
  else {
    local_888 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           in_stack_fffffffffffff118);
    local_880 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                          ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                           in_stack_fffffffffffff120,
                           (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           in_stack_fffffffffffff118);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff120,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                *)in_stack_fffffffffffff118);
    Eigen::EigenSolver<Eigen::Matrix<double,3,3,0,3,3>>::
    EigenSolver<Eigen::Matrix<double,3,3,0,3,3>>
              (in_stack_fffffffffffff180,in_stack_fffffffffffff178,(bool)computeEigenvectors);
    Eigen::EigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::eigenvalues(&local_ab8);
    Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<std::complex<double>,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff120,
               (Matrix<std::complex<double>,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff118);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff120,(Index)in_stack_fffffffffffff118,0xb895e9);
    auVar7._0_8_ = std::complex<double>::imag_abi_cxx11_(pSVar5);
    auVar7._8_8_ = 0;
    auVar11._8_8_ = 0x7fffffffffffffff;
    auVar11._0_8_ = 0x7fffffffffffffff;
    auVar6 = vpand_avx(auVar7,auVar11);
    dVar1 = (double)vmovlpd_avx(auVar6);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff120,(Index)in_stack_fffffffffffff118,0xb89634);
    auVar8._0_8_ = (double *)std::complex<double>::imag_abi_cxx11_(pSVar5);
    auVar8._8_8_ = 0;
    auVar12._8_8_ = 0x7fffffffffffffff;
    auVar12._0_8_ = 0x7fffffffffffffff;
    auVar6 = vpand_avx(auVar8,auVar12);
    dVar2 = (double)vmovlpd_avx(auVar6);
    matrix = (StorageBaseType *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff120,(Index)in_stack_fffffffffffff118,0xb8967f);
    auVar9._0_8_ = std::complex<double>::imag_abi_cxx11_((complex<double> *)matrix);
    auVar9._8_8_ = 0;
    auVar13._8_8_ = 0x7fffffffffffffff;
    auVar13._0_8_ = 0x7fffffffffffffff;
    auVar6 = vpand_avx(auVar9,auVar13);
    if (((local_820 <= dVar1) || (local_820 <= dVar2)) || (local_820 <= auVar6._0_8_)) {
      in_stack_fffffffffffff120 =
           (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff120,(Index)in_stack_fffffffffffff118,0xb89997);
      other_00 = (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)std::complex<double>::real_abi_cxx11_
                              ((complex<double> *)in_stack_fffffffffffff120);
      Eigen::operator*(auVar8._0_8_,matrix);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-
                (in_stack_fffffffffffff148,in_stack_fffffffffffff140);
      Eigen::Matrix<double,3,3,0,3,3>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff120,other_00);
      std::
      vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *)in_stack_fffffffffffff120,(value_type *)other_00);
    }
    else {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1>::
               operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffff120,(Index)in_stack_fffffffffffff118,0xb8971c);
      this = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             std::complex<double>::real_abi_cxx11_(pSVar5);
      Eigen::operator*(auVar8._0_8_,matrix);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-(this,in_stack_fffffffffffff140);
      Eigen::Matrix<double,3,3,0,3,3>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff120,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)in_stack_fffffffffffff118);
      std::
      vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *)in_stack_fffffffffffff120,(value_type *)in_stack_fffffffffffff118);
      other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1>::
                 operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1>
                             *)in_stack_fffffffffffff120,(Index)in_stack_fffffffffffff118,0xb897c6);
      std::complex<double>::real_abi_cxx11_((complex<double> *)other);
      Eigen::operator*(auVar8._0_8_,matrix);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-(this,other);
      Eigen::Matrix<double,3,3,0,3,3>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff120,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)in_stack_fffffffffffff118);
      std::
      vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *)in_stack_fffffffffffff120,(value_type *)in_stack_fffffffffffff118);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1>::
               operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffff120,(Index)in_stack_fffffffffffff118,0xb89870);
      std::complex<double>::real_abi_cxx11_(pSVar5);
      Eigen::operator*(auVar8._0_8_,matrix);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-(this,other);
      Eigen::Matrix<double,3,3,0,3,3>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff120,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)in_stack_fffffffffffff118);
      std::
      vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *)in_stack_fffffffffffff120,(value_type *)in_stack_fffffffffffff118);
    }
  }
  local_821 = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb89a59);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb89a66);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            (in_stack_fffffffffffff120);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb89a80);
  return in_RDI;
}

Assistant:

essentials_t sevenpt(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 6);

  Eigen::MatrixXd A(numberCorrespondences,9);

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    //bearingVector_t f1 = adapter.getBearingVector1(indices[i]);
    //bearingVector_t f2 = adapter.getBearingVector2(indices[i]);
    //The seven-point is computing the inverse transformation, which is why we
    //invert the input
    bearingVector_t f1 = adapter.getBearingVector2(indices[i]);
    bearingVector_t f2 = adapter.getBearingVector1(indices[i]);

    A.block<1,3>(i,0) = f2[0] * f1.transpose();
    A.block<1,3>(i,3) = f2[1] * f1.transpose();
    A.block<1,3>(i,6) = f2[2] * f1.transpose();
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      A,
      Eigen::ComputeFullU | Eigen::ComputeFullV );

  Eigen::Matrix<double,9,1> f1 = SVD.matrixV().col(8);
  Eigen::Matrix<double,9,1> f2 = SVD.matrixV().col(7);

  Eigen::MatrixXd F1_temp(3,3);
  F1_temp.col(0) = f1.block<3,1>(0,0);
  F1_temp.col(1) = f1.block<3,1>(3,0);
  F1_temp.col(2) = f1.block<3,1>(6,0);
  essential_t F1 = F1_temp.transpose();

  Eigen::MatrixXd F2_temp(3,3);
  F2_temp.col(0) = f2.block<3,1>(0,0);
  F2_temp.col(1) = f2.block<3,1>(3,0);
  F2_temp.col(2) = f2.block<3,1>(6,0);
  essential_t F2 = F2_temp.transpose();

  double eps = 0.00000001;
  essentials_t essentials;
  
  if( fabs(F1.determinant()) < eps || numberCorrespondences > 7 )
  {
    essentials.push_back(F1);
  }
  else
  {
    essential_t M = F2.inverse() * F1;
    Eigen::EigenSolver< essential_t > Eig(M,true);
    Eigen::Matrix< std::complex<double>,3,1 > D = Eig.eigenvalues();

    double val1 = fabs(D(0,0).imag());
    double val2 = fabs(D(1,0).imag());
    double val3 = fabs(D(2,0).imag());

    if( val1 < eps && val2 < eps && val3 < eps )
    {
      essentials.push_back( F1 - D(0,0).real() * F2 );
      essentials.push_back( F1 - D(1,0).real() * F2 );
      essentials.push_back( F1 - D(2,0).real() * F2 );
    }
    else
    {
      double min = val1;
      int minIndex = 0;
      if( val2 < min )
      {
        min = val2;
        minIndex = 1;
      }
      if( val3 < min )
        minIndex = 2;
      
      essentials.push_back( F1 - D(minIndex,0).real() * F2 );
    }
  }

  return essentials;
}